

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::base::DefaultLogDispatchCallback::dispatch(DefaultLogDispatchCallback *this,string_t *logLine)

{
  TypedConfigurations *pTVar1;
  bool bVar2;
  DispatchAction DVar3;
  Level LVar4;
  LogMessage *pLVar5;
  Logger *pLVar6;
  fstream_t *fs_00;
  long lVar7;
  ulong uVar8;
  element_type *peVar9;
  LogBuilder *this_00;
  ostream *this_01;
  fstream_t *fs;
  string_t *logLine_local;
  DefaultLogDispatchCallback *this_local;
  
  DVar3 = LogDispatchData::dispatchAction(this->m_data);
  if (DVar3 != NormalLog) {
    return;
  }
  pLVar5 = LogDispatchData::logMessage(this->m_data);
  pLVar6 = LogMessage::logger(pLVar5);
  pTVar1 = pLVar6->m_typedConfigurations;
  pLVar5 = LogDispatchData::logMessage(this->m_data);
  LVar4 = LogMessage::level(pLVar5);
  bVar2 = TypedConfigurations::toFile(pTVar1,LVar4);
  if (bVar2) {
    pLVar5 = LogDispatchData::logMessage(this->m_data);
    pLVar6 = LogMessage::logger(pLVar5);
    pTVar1 = pLVar6->m_typedConfigurations;
    pLVar5 = LogDispatchData::logMessage(this->m_data);
    LVar4 = LogMessage::level(pLVar5);
    fs_00 = TypedConfigurations::fileStream(pTVar1,LVar4);
    if (fs_00 != (fstream_t *)0x0) {
      lVar7 = std::__cxx11::string::c_str();
      std::__cxx11::string::size();
      std::ostream::write((char *)(fs_00 + 0x10),lVar7);
      uVar8 = std::ios::fail();
      if ((uVar8 & 1) == 0) {
        peVar9 = std::
                 __shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)elStorage);
        bVar2 = Storage::hasFlag(peVar9,ImmediateFlush);
        if (!bVar2) {
          pLVar5 = LogDispatchData::logMessage(this->m_data);
          pLVar6 = LogMessage::logger(pLVar5);
          pLVar5 = LogDispatchData::logMessage(this->m_data);
          LVar4 = LogMessage::level(pLVar5);
          bVar2 = Logger::isFlushNeeded(pLVar6,LVar4);
          if (!bVar2) goto LAB_00126426;
        }
        pLVar5 = LogDispatchData::logMessage(this->m_data);
        pLVar6 = LogMessage::logger(pLVar5);
        pLVar5 = LogDispatchData::logMessage(this->m_data);
        LVar4 = LogMessage::level(pLVar5);
        Logger::flush(pLVar6,LVar4,fs_00);
      }
    }
  }
LAB_00126426:
  pLVar5 = LogDispatchData::logMessage(this->m_data);
  pLVar6 = LogMessage::logger(pLVar5);
  pTVar1 = pLVar6->m_typedConfigurations;
  pLVar5 = LogDispatchData::logMessage(this->m_data);
  LVar4 = LogMessage::level(pLVar5);
  bVar2 = TypedConfigurations::toStandardOutput(pTVar1,LVar4);
  if (bVar2) {
    peVar9 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)elStorage);
    bVar2 = Storage::hasFlag(peVar9,ColoredTerminalOutput);
    if (bVar2) {
      pLVar5 = LogDispatchData::logMessage(this->m_data);
      pLVar6 = LogMessage::logger(pLVar5);
      this_00 = Logger::logBuilder(pLVar6);
      pLVar5 = LogDispatchData::logMessage(this->m_data);
      LVar4 = LogMessage::level(pLVar5);
      LogBuilder::convertToColoredOutput(this_00,logLine,LVar4);
    }
    this_01 = std::operator<<((ostream *)&std::cout,(string *)logLine);
    std::ostream::operator<<(this_01,std::flush<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void DefaultLogDispatchCallback::dispatch(base::type::string_t&& logLine) {
  if (m_data->dispatchAction() == base::DispatchAction::NormalLog) {
    if (m_data->logMessage()->logger()->m_typedConfigurations->toFile(m_data->logMessage()->level())) {
      base::type::fstream_t* fs = m_data->logMessage()->logger()->m_typedConfigurations->fileStream(
                                    m_data->logMessage()->level());
      if (fs != nullptr) {
        fs->write(logLine.c_str(), logLine.size());
        if (fs->fail()) {
          ELPP_INTERNAL_ERROR("Unable to write log to file ["
                              << m_data->logMessage()->logger()->m_typedConfigurations->filename(m_data->logMessage()->level()) << "].\n"
                              << "Few possible reasons (could be something else):\n" << "      * Permission denied\n"
                              << "      * Disk full\n" << "      * Disk is not writable", true);
        } else {
          if (ELPP->hasFlag(LoggingFlag::ImmediateFlush)
              || (m_data->logMessage()->logger()->isFlushNeeded(m_data->logMessage()->level()))) {
            m_data->logMessage()->logger()->flush(m_data->logMessage()->level(), fs);
          }
        }
      } else {
        ELPP_INTERNAL_ERROR("Log file for [" << LevelHelper::convertToString(m_data->logMessage()->level()) << "] "
                            << "has not been configured but [TO_FILE] is configured to TRUE. [Logger ID: "
                            << m_data->logMessage()->logger()->id() << "]", false);
      }
    }
    if (m_data->logMessage()->logger()->m_typedConfigurations->toStandardOutput(m_data->logMessage()->level())) {
      if (ELPP->hasFlag(LoggingFlag::ColoredTerminalOutput))
        m_data->logMessage()->logger()->logBuilder()->convertToColoredOutput(&logLine, m_data->logMessage()->level());
      ELPP_COUT << ELPP_COUT_LINE(logLine);
    }
  }
#if defined(ELPP_SYSLOG)
  else if (m_data->dispatchAction() == base::DispatchAction::SysLog) {
    // Determine syslog priority
    int sysLogPriority = 0;
    if (m_data->logMessage()->level() == Level::Fatal)
      sysLogPriority = LOG_EMERG;
    else if (m_data->logMessage()->level() == Level::Error)
      sysLogPriority = LOG_ERR;
    else if (m_data->logMessage()->level() == Level::Warning)
      sysLogPriority = LOG_WARNING;
    else if (m_data->logMessage()->level() == Level::Info)
      sysLogPriority = LOG_INFO;
    else if (m_data->logMessage()->level() == Level::Debug)
      sysLogPriority = LOG_DEBUG;
    else
      sysLogPriority = LOG_NOTICE;
#  if defined(ELPP_UNICODE)
    char* line = base::utils::Str::wcharPtrToCharPtr(logLine.c_str());
    syslog(sysLogPriority, "%s", line);
    free(line);
#  else
    syslog(sysLogPriority, "%s", logLine.c_str());
#  endif
  }
#endif  // defined(ELPP_SYSLOG)
}